

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O2

int __thiscall
ActionStackPtrFlow::clone
          (ActionStackPtrFlow *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  string *nm;
  bool bVar1;
  ActionStackPtrFlow *this_00;
  
  nm = &(this->super_Action).basegroup;
  bVar1 = ActionGroupList::contains((ActionGroupList *)__fn,nm);
  if (bVar1) {
    this_00 = (ActionStackPtrFlow *)operator_new(0x78);
    ActionStackPtrFlow(this_00,nm,this->stackspace);
  }
  else {
    this_00 = (ActionStackPtrFlow *)0x0;
  }
  return (int)this_00;
}

Assistant:

virtual Action *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Action *)0;
    return new ActionStackPtrFlow(getGroup(),stackspace);
  }